

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

int __thiscall
ImFontAtlas::AddCustomRectFontGlyph
          (ImFontAtlas *this,ImFont *font,ImWchar id,int width,int height,float advance_x,
          ImVec2 *offset)

{
  ImVec2 IVar1;
  int iVar2;
  ImFontAtlasCustomRect *pIVar3;
  ulong uVar4;
  ImFontAtlasCustomRect *pIVar5;
  int iVar6;
  int iVar7;
  
  IVar1 = *offset;
  iVar7 = (this->CustomRects).Size;
  iVar2 = (this->CustomRects).Capacity;
  if (iVar7 == iVar2) {
    iVar7 = iVar7 + 1;
    if (iVar2 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar2 / 2 + iVar2;
    }
    if (iVar7 < iVar6) {
      iVar7 = iVar6;
    }
    if (iVar2 < iVar7) {
      pIVar5 = (ImFontAtlasCustomRect *)ImGui::MemAlloc((long)iVar7 << 5);
      pIVar3 = (this->CustomRects).Data;
      if (pIVar3 != (ImFontAtlasCustomRect *)0x0) {
        memcpy(pIVar5,pIVar3,(long)(this->CustomRects).Size << 5);
        ImGui::MemFree((this->CustomRects).Data);
      }
      (this->CustomRects).Data = pIVar5;
      (this->CustomRects).Capacity = iVar7;
    }
  }
  uVar4 = (ulong)(uint)width & 0xffffffff0000ffff | (ulong)(ushort)height << 0x10 |
          0xffffffff00000000;
  pIVar5 = (this->CustomRects).Data;
  iVar7 = (this->CustomRects).Size;
  pIVar3 = pIVar5 + iVar7;
  pIVar3->Width = (short)uVar4;
  pIVar3->Height = (short)(uVar4 >> 0x10);
  pIVar3->X = (short)(uVar4 >> 0x20);
  pIVar3->Y = (short)(uVar4 >> 0x30);
  pIVar5[iVar7].GlyphID = (uint)id;
  pIVar5[iVar7].GlyphAdvanceX = advance_x;
  pIVar5[iVar7].GlyphOffset = IVar1;
  pIVar5[iVar7].Font = font;
  iVar7 = (this->CustomRects).Size;
  (this->CustomRects).Size = iVar7 + 1;
  return iVar7;
}

Assistant:

int ImFontAtlas::AddCustomRectFontGlyph(ImFont* font, ImWchar id, int width, int height, float advance_x, const ImVec2& offset)
{
#ifdef IMGUI_USE_WCHAR32
    IM_ASSERT(id <= IM_UNICODE_CODEPOINT_MAX);
#endif
    IM_ASSERT(font != NULL);
    IM_ASSERT(width > 0 && width <= 0xFFFF);
    IM_ASSERT(height > 0 && height <= 0xFFFF);
    ImFontAtlasCustomRect r;
    r.Width = (unsigned short)width;
    r.Height = (unsigned short)height;
    r.GlyphID = id;
    r.GlyphAdvanceX = advance_x;
    r.GlyphOffset = offset;
    r.Font = font;
    CustomRects.push_back(r);
    return CustomRects.Size - 1; // Return index
}